

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int enc_uint64(archive_write *a,uint64_t val)

{
  ssize_t sVar1;
  ulong in_RSI;
  size_t in_RDI;
  int i;
  void *unaff_retaddr;
  undefined8 in_stack_00000008;
  uint8_t numdata [9];
  uint mask;
  int local_24;
  byte local_1d [9];
  uint local_14;
  
  local_14 = 0x80;
  local_1d[0] = 0;
  local_24 = 1;
  do {
    if (8 < local_24) {
LAB_001a9071:
      sVar1 = compress_out((archive_write *)in_stack_00000008,unaff_retaddr,in_RDI,
                           (la_zaction)(in_RSI >> 0x20));
      return (int)sVar1;
    }
    if (in_RSI < local_14) {
      local_1d[0] = local_1d[0] | (byte)in_RSI;
      goto LAB_001a9071;
    }
    local_1d[local_24] = (byte)in_RSI;
    in_RSI = in_RSI >> 8;
    local_1d[0] = local_1d[0] | (byte)local_14;
    local_14 = local_14 >> 1;
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

static int
enc_uint64(struct archive_write *a, uint64_t val)
{
	unsigned mask = 0x80;
	uint8_t numdata[9];
	int i;

	numdata[0] = 0;
	for (i = 1; i < (int)sizeof(numdata); i++) {
		if (val < mask) {
			numdata[0] |= (uint8_t)val;
			break;
		}
		numdata[i] = (uint8_t)val;
		val >>= 8;
		numdata[0] |= mask;
		mask >>= 1;
	}
	return ((int)compress_out(a, numdata, i, ARCHIVE_Z_RUN));
}